

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O2

ssize_t __thiscall
Dashel::FileDescriptorStream::write(FileDescriptorStream *this,int __fd,void *__buf,size_t __n)

{
  _func_int *p_Var1;
  ssize_t in_RAX;
  int *piVar2;
  undefined4 in_register_00000034;
  void *__buf_00;
  
  __buf_00 = (void *)CONCAT44(in_register_00000034,__fd);
  if ((this->super_DisconnectableStream).super_SelectableStream.fd < 0) {
    __assert_fail("fd >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/aseba-community[P]dashel/dashel/dashel-posix.cpp"
                  ,0x311,
                  "virtual void Dashel::FileDescriptorStream::write(const void *, const size_t)");
  }
  if (__buf != (void *)0x0) {
    for (; __buf != (void *)0x0; __buf = (void *)((long)__buf - in_RAX)) {
      in_RAX = ::write((this->super_DisconnectableStream).super_SelectableStream.fd,__buf_00,
                       (size_t)__buf);
      if (in_RAX < 0) {
        p_Var1 = (this->super_DisconnectableStream).super_SelectableStream._vptr_SelectableStream
                 [-3];
        piVar2 = __errno_location();
        Stream::fail((Stream *)
                     ((long)&(this->super_DisconnectableStream).super_SelectableStream.
                             _vptr_SelectableStream + (long)p_Var1),IOError,*piVar2,
                     "File write I/O error.");
      }
      if (in_RAX == 0) {
        Stream::fail((Stream *)
                     ((long)&(this->super_DisconnectableStream).super_SelectableStream.
                             _vptr_SelectableStream +
                     (long)(this->super_DisconnectableStream).super_SelectableStream.
                           _vptr_SelectableStream[-3]),ConnectionLost,0,"File full.");
      }
      __buf_00 = (void *)((long)__buf_00 + in_RAX);
    }
  }
  return in_RAX;
}

Assistant:

virtual void write(const void* data, const size_t size)
		{
			assert(fd >= 0);

			if (size == 0)
				return;

			const char* ptr = (const char*)data;
			size_t left = size;

			while (left)
			{
				ssize_t len = ::write(fd, ptr, left);

				if (len < 0)
				{
					fail(DashelException::IOError, errno, "File write I/O error.");
				}
				else if (len == 0)
				{
					fail(DashelException::ConnectionLost, 0, "File full.");
				}
				else
				{
					ptr += len;
					left -= len;
				}
			}
		}